

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAddiEa<(moira::Instr)6,(moira::Mode)4,(moira::Size)1>(Moira *this,u16 opcode)

{
  int *piVar1;
  byte bVar2;
  u32 addr;
  u32 uVar3;
  bool bVar4;
  byte bVar5;
  u32 val;
  uint n;
  
  bVar5 = (byte)(this->queue).irc;
  readExt(this);
  n = opcode & 7;
  addr = computeEA<(moira::Mode)4,(moira::Size)1,0ul>(this,n);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)1,64ul>(this,addr);
  piVar1 = (int *)((long)this->exec + (ulong)n * 4 + -0x38);
  *piVar1 = *piVar1 + (-1 - (uint)((~(uint)opcode & 7) == 0));
  val = uVar3 + bVar5;
  bVar4 = (bool)((byte)(val >> 8) & 1);
  (this->reg).sr.c = bVar4;
  (this->reg).sr.x = bVar4;
  bVar2 = (byte)val;
  (this->reg).sr.v = (bool)((byte)(((byte)uVar3 ^ bVar2) & (bVar5 ^ bVar2)) >> 7);
  (this->reg).sr.z = bVar2 == 0;
  (this->reg).sr.n = (bool)(bVar2 >> 7);
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,addr,val);
  return;
}

Assistant:

void
Moira::execAddiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}